

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.h
# Opt level: O3

pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Line<3L>::closest_point
          (pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *__return_storage_ptr__,Vector *point
          ,Vector *line_a,Vector *line_b,bool is_infinite)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  dVar2 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar5 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0] - dVar3;
  dVar6 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1] - dVar2;
  dVar4 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  dVar7 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2] - dVar4;
  dVar8 = dVar7 * dVar7 + dVar6 * dVar6 + dVar5 * dVar5;
  if (1e-14 <= dVar8) {
    dVar8 = 1.0 / dVar8;
    dVar8 = ((point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[2] - dVar4) * dVar7 * dVar8 +
            ((point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[1] - dVar2) * dVar8 * dVar6 +
            ((point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[0] - dVar3) * dVar8 * dVar5;
    if (0.0 <= dVar8 || is_infinite) {
      if (dVar8 <= 1.0 || is_infinite) {
        dVar2 = dVar2 + dVar6 * dVar8;
        __return_storage_ptr__->first = dVar8;
        auVar1._8_4_ = SUB84(dVar2,0);
        auVar1._0_8_ = dVar3 + dVar5 * dVar8;
        auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
        *(undefined1 (*) [16])
         (__return_storage_ptr__->second).
         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array =
             auVar1;
        (__return_storage_ptr__->second).
        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
             dVar4 + dVar7 * dVar8;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->first = 1.0;
      dVar4 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
              m_data.array[1];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[0] =
           (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[1] = dVar4;
      dVar4 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
              m_data.array[2];
      goto LAB_00196672;
    }
  }
  __return_storage_ptr__->first = 0.0;
  dVar4 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] =
       (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[1] = dVar4;
  dVar4 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
LAB_00196672:
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

static std::pair<double, Vector> closest_point(const Vector& point, const Vector& line_a, const Vector& line_b, bool is_infinite=false)
    {
        const Vector v = line_b - line_a;
        const double l = v.squaredNorm();

        if (l < 1e-14) {
            return {0.0, line_a};
        }

        const Vector o = line_a;
        const Vector r = v * (1.0 / l);
        const double t = (point - o).dot(r);

        if (!is_infinite && t < 0) {
            return {0.0, line_a};
        }
        
        if (!is_infinite && t > 1) {
            return {1.0, line_b};
        }

        const Vector closest_point = line_a + t * (line_b - line_a);

        return {t, closest_point};
    }